

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_from_python.hpp
# Opt level: O2

void boost::python::converter::shared_ptr_from_python<NeuralConsumer,_boost::shared_ptr>::construct
               (PyObject *source,rvalue_from_python_stage1_data *data)

{
  shared_ptr<void> hold_convertible_ref_count;
  shared_ptr_deleter local_30;
  handle<_object> local_28;
  shared_ptr<void> local_20;
  
  if ((PyObject *)data->convertible == source) {
    data[1].convertible = (void *)0x0;
    data[1].construct = (constructor_function)0x0;
  }
  else {
    local_28.m_p = python::detail::manage_ptr<_object>((borrowed<_object> *)source,0);
    shared_ptr_deleter::shared_ptr_deleter(&local_30);
    shared_ptr<void>::shared_ptr<void,boost::python::converter::shared_ptr_deleter>
              (&local_20,(void *)0x0,&local_30);
    shared_ptr_deleter::~shared_ptr_deleter(&local_30);
    handle<_object>::~handle(&local_28);
    data[1].convertible = data->convertible;
    data[1].construct = (constructor_function)local_20.pn.pi_;
    if (local_20.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_20.pn.pi_)->use_count_ = (local_20.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    boost::detail::shared_count::~shared_count(&local_20.pn);
  }
  data->convertible = data + 1;
  return;
}

Assistant:

static void construct(PyObject* source, rvalue_from_python_stage1_data* data)
  {
    void* const storage = ((converter::rvalue_from_python_storage<SP<T> >*)data)->storage.bytes;
    // Deal with the "None" case.
    if (data->convertible == source)
      new (storage) SP<T>();
    else
    {
      SP<void> hold_convertible_ref_count(
	 (void*)0, shared_ptr_deleter(handle<>(borrowed(source))) );
      // use aliasing constructor
      new (storage) SP<T>(hold_convertible_ref_count,
			  static_cast<T*>(data->convertible));
    }

    data->convertible = storage;
  }